

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

cmInstallTargetGenerator *
CreateInstallTargetGenerator
          (cmTarget *target,cmInstallCommandArguments *args,bool impLib,bool forceOpt)

{
  bool bVar1;
  MessageLevel message_00;
  cmMakefile *mf;
  cmInstallTargetGenerator *this;
  char *dest;
  char *file_permissions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations;
  char *component;
  undefined1 local_91;
  MessageLevel message;
  bool forceOpt_local;
  bool impLib_local;
  cmInstallCommandArguments *args_local;
  cmTarget *target_local;
  
  mf = cmTarget::GetMakefile(target);
  message_00 = cmInstallGenerator::SelectMessageLevel(mf,false);
  this = (cmInstallTargetGenerator *)operator_new(0xe8);
  cmInstallCommandArguments::GetDestination_abi_cxx11_(args);
  dest = (char *)std::__cxx11::string::c_str();
  cmInstallCommandArguments::GetPermissions_abi_cxx11_(args);
  file_permissions = (char *)std::__cxx11::string::c_str();
  configurations = cmInstallCommandArguments::GetConfigurations_abi_cxx11_(args);
  cmInstallCommandArguments::GetComponent_abi_cxx11_(args);
  component = (char *)std::__cxx11::string::c_str();
  bVar1 = cmInstallCommandArguments::GetOptional(args);
  local_91 = 1;
  if (!bVar1) {
    local_91 = forceOpt;
  }
  cmInstallTargetGenerator::cmInstallTargetGenerator
            (this,target,dest,impLib,file_permissions,configurations,component,message_00,
             (bool)(local_91 & 1));
  return this;
}

Assistant:

static cmInstallTargetGenerator* CreateInstallTargetGenerator(cmTarget& target,
     const cmInstallCommandArguments& args, bool impLib, bool forceOpt = false)
{
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(target.GetMakefile());
  return new cmInstallTargetGenerator(target, args.GetDestination().c_str(),
                        impLib, args.GetPermissions().c_str(),
                        args.GetConfigurations(), args.GetComponent().c_str(),
                        message,
                        args.GetOptional() || forceOpt);
}